

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O1

void __thiscall Percentile::modelToQueries(Percentile *this)

{
  pointer *pppAVar1;
  _WordT *p_Var2;
  iterator iVar3;
  pointer ppAVar4;
  iterator __position;
  Query **ppQVar5;
  Aggregate *pAVar6;
  Query *pQVar7;
  ulong uVar8;
  size_t var;
  ulong uVar9;
  ulong uVar10;
  Aggregate *agg_1;
  Aggregate *agg;
  Aggregate *local_108;
  Aggregate *local_100;
  Percentile *local_f8;
  bitset<1500UL> local_f0;
  
  ppQVar5 = (Query **)operator_new__(0x328);
  this->varToQuery = ppQVar5;
  pAVar6 = (Aggregate *)operator_new(0x30);
  (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar6->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar6->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar6->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = pAVar6;
  memset(&local_f0,0,0xc0);
  iVar3._M_current =
       (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
    _M_realloc_insert<std::bitset<1500ul>>
              ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar6,iVar3,
               &local_f0);
  }
  else {
    memset(iVar3._M_current,0,0xc0);
    (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pQVar7 = (Query *)operator_new(0x30);
  (pQVar7->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pQVar7->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  ppAVar4 = (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar4 == (pointer)0x0) {
    std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
              ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar7->_aggregates,(iterator)0x0,
               &local_100);
  }
  else {
    *ppAVar4 = local_100;
    pppAVar1 = &(pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar7);
  this->varToQuery[100] = pQVar7;
  uVar9 = 0;
  local_f8 = this;
  do {
    uVar8 = uVar9 >> 6;
    uVar10 = 1L << ((byte)uVar9 & 0x3f);
    if ((((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[uVar8] >> (uVar9 & 0x3f)
         & 1) != 0) &&
       (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar8] &
        uVar10) == 0)) {
      pAVar6 = (Aggregate *)operator_new(0x30);
      (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar6->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pAVar6->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar6->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar6->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108 = pAVar6;
      memset(&local_f0,0,0xc0);
      iVar3._M_current =
           (pAVar6->_agg).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pAVar6->_agg).
          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
        _M_realloc_insert<std::bitset<1500ul>>
                  ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar6,iVar3,
                   &local_f0);
      }
      else {
        memset(iVar3._M_current,0,0xc0);
        (pAVar6->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pQVar7 = (Query *)operator_new(0x30);
      this = local_f8;
      (pQVar7->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
      (pQVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
      (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pQVar7->_rootID = local_f8->_queryRootIndex[uVar9];
      p_Var2 = (pQVar7->_fVars).super__Base_bitset<2UL>._M_w + uVar8;
      *p_Var2 = *p_Var2 | uVar10;
      __position._M_current =
           (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pQVar7->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar7->_aggregates,__position,
                   &local_108);
      }
      else {
        *__position._M_current = local_108;
        pppAVar1 = &(pQVar7->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar1 = *pppAVar1 + 1;
      }
      QueryCompiler::addQuery
                ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pQVar7);
      this->varToQuery[uVar9] = pQVar7;
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 100);
  return;
}

Assistant:

void Percentile::modelToQueries()
{
    varToQuery = new Query*[NUM_OF_VARIABLES+1];

    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    Query* count = new Query();
    count->_rootID = _td->_root->_id;
    count->_aggregates.push_back(agg);            
    _compiler->addQuery(count);

    varToQuery[NUM_OF_VARIABLES] = count;

    // Create a query & Aggregate
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_isFeature[var] && !_isCategoricalFeature[var])
        {
            Aggregate* agg = new Aggregate();
            agg->_agg.push_back(prod_bitset());

            Query* query = new Query();
            query->_rootID = _queryRootIndex[var];
            query->_fVars.set(var);
            query->_aggregates.push_back(agg);
            
            _compiler->addQuery(query);

            varToQuery[var] = query;
        }
    }
}